

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::addStructBuffArguments
          (HlslParseContext *this,TSourceLoc *loc,TIntermAggregate **aggregate)

{
  TIntermediate *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  iterator __first;
  undefined4 extraout_var_00;
  iterator __last;
  undefined4 extraout_var_01;
  size_type sVar3;
  undefined4 extraout_var_02;
  reference ppTVar4;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  TType *type;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *name;
  mapped_type_conflict2 *pmVar5;
  undefined4 extraout_var_07;
  TIntermSymbol *local_148;
  TIntermSymbol *local_140;
  TIntermSymbol *sym;
  TVariable *variable;
  TString counterBlockName;
  TType counterType;
  TIntermSymbol *blockSym;
  undefined1 local_60 [4];
  int param;
  TIntermSequence argsWithCounterBuffers;
  bool hasStructBuffArg;
  TIntermAggregate **aggregate_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  iVar2 = (*((*aggregate)->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
            _vptr_TIntermNode[0x32])();
  __first = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::begin
                      ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                       CONCAT44(extraout_var,iVar2));
  iVar2 = (*((*aggregate)->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
            _vptr_TIntermNode[0x32])();
  __last = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::end
                     ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                      CONCAT44(extraout_var_00,iVar2));
  argsWithCounterBuffers.super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
  super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  bVar1 = std::
          any_of<__gnu_cxx::__normal_iterator<TIntermNode**,std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>>,glslang::HlslParseContext::addStructBuffArguments(glslang::TSourceLoc_const&,glslang::TIntermAggregate*&)::__0>
                    ((__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                      )__first._M_current,
                     (__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                      )__last._M_current,(anon_class_8_1_8991fb9c_for__M_pred)this);
  if (bVar1) {
    TVector<TIntermNode_*>::TVector((TVector<TIntermNode_*> *)local_60);
    blockSym._4_4_ = 0;
    while( true ) {
      iVar2 = (*((*aggregate)->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x32])();
      sVar3 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size
                        ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                         CONCAT44(extraout_var_01,iVar2));
      if ((int)sVar3 <= blockSym._4_4_) break;
      iVar2 = (*((*aggregate)->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x32])();
      ppTVar4 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                          ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                           CONCAT44(extraout_var_02,iVar2),(long)blockSym._4_4_);
      std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::push_back
                ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)local_60,ppTVar4)
      ;
      iVar2 = (*((*aggregate)->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x32])();
      ppTVar4 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                          ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                           CONCAT44(extraout_var_03,iVar2),(long)blockSym._4_4_);
      iVar2 = (*(*ppTVar4)->_vptr_TIntermNode[3])();
      type = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_04,iVar2) + 0xf0))();
      bVar1 = hasStructBuffCounter(this,type);
      if (bVar1) {
        iVar2 = (*((*aggregate)->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x32])();
        ppTVar4 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                            ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                             CONCAT44(extraout_var_05,iVar2),(long)blockSym._4_4_);
        iVar2 = (*(*ppTVar4)->_vptr_TIntermNode[0xc])();
        if ((long *)CONCAT44(extraout_var_06,iVar2) != (long *)0x0) {
          TType::TType((TType *)((long)&counterBlockName.field_2 + 8),EbtVoid,EvqTemporary,1,0,0,
                       false);
          counterBufferType(this,loc,(TType *)((long)&counterBlockName.field_2 + 8));
          this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          name = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar2) + 400))();
          TIntermediate::
          addCounterBufferName<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>
                    ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                     &variable,this_00,name);
          sym = (TIntermSymbol *)
                makeInternalVariable
                          (this,(TString *)&variable,(TType *)((long)&counterBlockName.field_2 + 8))
          ;
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_bool>_>_>
                   ::operator[](&(this->structBufferCounter).
                                 super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_bool>_>_>
                                ,(key_type *)&variable);
          *pmVar5 = true;
          local_148 = TIntermediate::addSymbol
                                ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                                 (TVariable *)sym,loc);
          local_140 = local_148;
          std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::push_back
                    ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)local_60,
                     (value_type *)&local_148);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)&variable);
          TType::~TType((TType *)((long)&counterBlockName.field_2 + 8));
        }
      }
      blockSym._4_4_ = blockSym._4_4_ + 1;
    }
    iVar2 = (*((*aggregate)->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x32])();
    std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::swap
              ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
               CONCAT44(extraout_var_07,iVar2),
               (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)local_60);
    TVector<TIntermNode_*>::~TVector((TVector<TIntermNode_*> *)local_60);
  }
  return;
}

Assistant:

void HlslParseContext::addStructBuffArguments(const TSourceLoc& loc, TIntermAggregate*& aggregate)
{
    // See if there are any SB types with counters.
    const bool hasStructBuffArg =
        std::any_of(aggregate->getSequence().begin(),
                    aggregate->getSequence().end(),
                    [this](const TIntermNode* node) {
                        return (node && node->getAsTyped() != nullptr) && hasStructBuffCounter(node->getAsTyped()->getType());
                    });

    // Nothing to do, if we didn't find one.
    if (! hasStructBuffArg)
        return;

    TIntermSequence argsWithCounterBuffers;

    for (int param = 0; param < int(aggregate->getSequence().size()); ++param) {
        argsWithCounterBuffers.push_back(aggregate->getSequence()[param]);

        if (hasStructBuffCounter(aggregate->getSequence()[param]->getAsTyped()->getType())) {
            const TIntermSymbol* blockSym = aggregate->getSequence()[param]->getAsSymbolNode();
            if (blockSym != nullptr) {
                TType counterType;
                counterBufferType(loc, counterType);

                const TString counterBlockName(intermediate.addCounterBufferName(blockSym->getName()));

                TVariable* variable = makeInternalVariable(counterBlockName, counterType);

                // Mark this buffer's counter block as being in use
                structBufferCounter[counterBlockName] = true;

                TIntermSymbol* sym = intermediate.addSymbol(*variable, loc);
                argsWithCounterBuffers.push_back(sym);
            }
        }
    }

    // Swap with the temp list we've built up.
    aggregate->getSequence().swap(argsWithCounterBuffers);
}